

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_st(DisasContext_conflict6 *ctx,uint32_t opc,int rt,int base,int offset)

{
  TCGContext_conflict6 *tcg_ctx;
  TCGTemp *ts;
  uintptr_t o_2;
  TCGv_i64 addr;
  TCGv_i64 t;
  TCGv_i32 pTVar1;
  TCGArg idx;
  int val;
  code *func;
  MemOp_conflict2 memop;
  uintptr_t o_1;
  uintptr_t o;
  TCGTemp *local_58;
  TCGv_i64 local_50;
  TCGv_i64 local_48;
  TCGTemp *local_40;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  addr = tcg_temp_new_i64(tcg_ctx);
  t = tcg_temp_new_i64(tcg_ctx);
  val = ctx->mem_idx;
  gen_base_offset_addr(ctx,addr,base,offset);
  gen_load_gpr(tcg_ctx,t,rt);
  switch(opc) {
  case 0x7c00001c:
    val = 2;
    goto LAB_00870ccb;
  case 0x7c00001d:
    val = 2;
LAB_00870c43:
    idx = (TCGArg)val;
    memop = ctx->default_tcg_memop_mask | MO_16;
    break;
  case 0x7c00001e:
  case 0x7c000020:
    goto switchD_00870b55_caseD_7c00001e;
  case 0x7c00001f:
    val = 2;
LAB_00870c55:
    idx = (TCGArg)val;
    memop = ctx->default_tcg_memop_mask | MO_32;
    break;
  case 0x7c000021:
    val = 2;
LAB_00870c70:
    pTVar1 = tcg_const_i32_mips64el(tcg_ctx,val);
    local_58 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    local_40 = (TCGTemp *)(pTVar1 + (long)tcg_ctx);
    func = helper_swl_mips64el;
LAB_00870ca9:
    ts = local_40;
    local_48 = addr + (long)&tcg_ctx->pool_cur;
    local_50 = t + (long)&tcg_ctx->pool_cur;
    tcg_gen_callN_mips64el(tcg_ctx,func,(TCGTemp *)0x0,4,&local_58);
    tcg_temp_free_internal_mips64el(tcg_ctx,ts);
    goto switchD_00870b55_caseD_7c00001e;
  case 0x7c000022:
    val = 2;
LAB_00870bc2:
    pTVar1 = tcg_const_i32_mips64el(tcg_ctx,val);
    local_58 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    local_40 = (TCGTemp *)(pTVar1 + (long)tcg_ctx);
    func = helper_swr_mips64el;
    goto LAB_00870ca9;
  default:
    if (opc != 0xa0000000) {
      if (opc != 0xa4000000) {
        if (opc == 0xa8000000) goto LAB_00870c70;
        if (opc == 0xac000000) goto LAB_00870c55;
        if (opc == 0xb0000000) {
          pTVar1 = tcg_const_i32_mips64el(tcg_ctx,val);
          local_58 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
          local_40 = (TCGTemp *)(pTVar1 + (long)tcg_ctx);
          func = helper_sdl_mips64el;
        }
        else {
          if (opc != 0xb4000000) {
            if (opc == 0xb8000000) goto LAB_00870bc2;
            if (opc != 0xfc000000) goto switchD_00870b55_caseD_7c00001e;
            idx = (TCGArg)val;
            memop = ctx->default_tcg_memop_mask | MO_64;
            break;
          }
          pTVar1 = tcg_const_i32_mips64el(tcg_ctx,val);
          local_58 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
          local_40 = (TCGTemp *)(pTVar1 + (long)tcg_ctx);
          func = helper_sdr_mips64el;
        }
        goto LAB_00870ca9;
      }
      goto LAB_00870c43;
    }
LAB_00870ccb:
    idx = (TCGArg)val;
    memop = MO_8;
  }
  tcg_gen_qemu_st_i64_mips64el(tcg_ctx,t,addr,idx,memop);
switchD_00870b55_caseD_7c00001e:
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(addr + (long)tcg_ctx));
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(t + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_st(DisasContext *ctx, uint32_t opc, int rt,
                   int base, int offset)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0 = tcg_temp_new(tcg_ctx);
    TCGv t1 = tcg_temp_new(tcg_ctx);
    int mem_idx = ctx->mem_idx;

    gen_base_offset_addr(ctx, t0, base, offset);
    gen_load_gpr(tcg_ctx, t1, rt);
    switch (opc) {
#if defined(TARGET_MIPS64)
    case OPC_SD:
        tcg_gen_qemu_st_tl(tcg_ctx, t1, t0, mem_idx, MO_TEQ |
                           ctx->default_tcg_memop_mask);
        break;
    case OPC_SDL:
        gen_helper_0e2i(sdl, t1, t0, mem_idx);
        break;
    case OPC_SDR:
        gen_helper_0e2i(sdr, t1, t0, mem_idx);
        break;
#endif
    case OPC_SWE:
        mem_idx = MIPS_HFLAG_UM;
        /* fall through */
    case OPC_SW:
        tcg_gen_qemu_st_tl(tcg_ctx, t1, t0, mem_idx, MO_TEUL |
                           ctx->default_tcg_memop_mask);
        break;
    case OPC_SHE:
        mem_idx = MIPS_HFLAG_UM;
        /* fall through */
    case OPC_SH:
        tcg_gen_qemu_st_tl(tcg_ctx, t1, t0, mem_idx, MO_TEUW |
                           ctx->default_tcg_memop_mask);
        break;
    case OPC_SBE:
        mem_idx = MIPS_HFLAG_UM;
        /* fall through */
    case OPC_SB:
        tcg_gen_qemu_st_tl(tcg_ctx, t1, t0, mem_idx, MO_8);
        break;
    case OPC_SWLE:
        mem_idx = MIPS_HFLAG_UM;
        /* fall through */
    case OPC_SWL:
        gen_helper_0e2i(swl, t1, t0, mem_idx);
        break;
    case OPC_SWRE:
        mem_idx = MIPS_HFLAG_UM;
        /* fall through */
    case OPC_SWR:
        gen_helper_0e2i(swr, t1, t0, mem_idx);
        break;
    }
    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free(tcg_ctx, t1);
}